

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
::ClipWithFunctionValues
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
           *this,FuncGraphDomain *grDom)

{
  double *pdVar1;
  double *pdVar2;
  double *in_RSI;
  long *in_RDI;
  double preuby;
  double prelby;
  double imubx;
  double imlbx;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double *local_10;
  
  local_10 = in_RSI;
  local_18 = (double)(**(code **)(*in_RDI + 0x48))(*in_RSI);
  local_20 = (double)(**(code **)(*in_RDI + 0x48))(local_10[1]);
  local_28 = (double)(**(code **)(*in_RDI + 0x50))(local_10[2]);
  local_30 = (double)(**(code **)(*in_RDI + 0x50))(local_10[3]);
  pdVar2 = local_10;
  pdVar1 = std::min<double>(&local_28,&local_30);
  pdVar2 = std::max<double>(pdVar2,pdVar1);
  *local_10 = *pdVar2;
  pdVar2 = local_10 + 1;
  pdVar1 = std::max<double>(&local_28,&local_30);
  pdVar2 = std::min<double>(pdVar2,pdVar1);
  local_10[1] = *pdVar2;
  pdVar2 = local_10 + 2;
  pdVar1 = std::min<double>(&local_18,&local_20);
  pdVar2 = std::max<double>(pdVar2,pdVar1);
  local_10[2] = *pdVar2;
  pdVar2 = local_10 + 3;
  pdVar1 = std::max<double>(&local_18,&local_20);
  pdVar2 = std::min<double>(pdVar2,pdVar1);
  local_10[3] = *pdVar2;
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::ClipWithFunctionValues(
    FuncGraphDomain &grDom) const {
  auto imlbx = eval(grDom.lbx);
  auto imubx = eval(grDom.ubx);
  auto prelby = inverse(grDom.lby);
  auto preuby = inverse(grDom.uby);
  grDom.lbx = std::max( grDom.lbx, std::min(prelby, preuby) );
  grDom.ubx = std::min( grDom.ubx, std::max(prelby, preuby) );
  grDom.lby = std::max( grDom.lby, std::min(imlbx, imubx) );
  grDom.uby = std::min( grDom.uby, std::max(imlbx, imubx) );
}